

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void ns_call(ns_connection *nc,int ev,void *p)

{
  int len;
  uint dst_len;
  ulong uVar1;
  FILE *__stream;
  time_t tVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char local_b8 [64];
  char src [60];
  
  pcVar4 = nc->mgr->hexdump_file;
  if (ev != 0 && pcVar4 != (char *)0x0) {
    uVar1 = 0;
    if (ev - 3U < 2) {
      uVar1 = (ulong)*p;
    }
    lVar5 = 0x38;
    if (ev == 4) {
      lVar5 = 0x50;
    }
    __stream = fopen64(pcVar4,"a");
    if (__stream != (FILE *)0x0) {
      ns_sock_to_str(nc->sock,src,0x3c,3);
      ns_sock_to_str(nc->sock,local_b8,0x3c,7);
      tVar2 = time((time_t *)0x0);
      pcVar4 = "->";
      if (ev == 3) {
        pcVar4 = "<-";
      }
      if (1 < ev - 3U) {
        if (ev == 1) {
          pcVar4 = "<A";
        }
        else {
          pcVar4 = "XX";
          if (ev == 2) {
            pcVar4 = "C>";
          }
        }
      }
      fprintf(__stream,"%lu %p %s %s %s %d\n",tVar2,nc->user_data,src,pcVar4,local_b8,uVar1);
      len = (int)uVar1;
      if (0 < len) {
        dst_len = len * 5 + 100;
        pcVar4 = (char *)malloc((ulong)dst_len);
        if (pcVar4 != (char *)0x0) {
          if (ev == 4) {
            uVar1 = 0;
            lVar3 = 0;
          }
          else {
            lVar3 = *(long *)((long)&nc->prev + lVar5);
          }
          ns_hexdump((void *)((*(long *)((long)&nc->next + lVar5) + lVar3) - uVar1),len,pcVar4,
                     dst_len);
          fputs(pcVar4,__stream);
          free(pcVar4);
        }
      }
      fclose(__stream);
    }
  }
  (*nc->callback)(nc,ev,p);
  return;
}

Assistant:

static void ns_call(struct ns_connection *nc, int ev, void *p) {
  if (nc->mgr->hexdump_file != NULL && ev != NS_POLL) {
    int len = (ev == NS_RECV || ev == NS_SEND) ? * (int *) p : 0;
    hexdump(nc, nc->mgr->hexdump_file, len, ev);
  }

  nc->callback(nc, ev, p);
}